

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O1

string * __thiscall FieldType::getName_abi_cxx11_(string *__return_storage_ptr__,FieldType *this)

{
  pointer pcVar1;
  pointer pFVar2;
  long *plVar3;
  long *plVar4;
  pointer this_00;
  long *local_70;
  long local_60;
  long lStack_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->name)._M_string_length);
  if ((this->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    this_00 = (this->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (this->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (this_00 != pFVar2) {
      do {
        getName_abi_cxx11_(&local_50,this_00);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_60 = *plVar4;
          lStack_58 = plVar3[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar4;
          local_70 = (long *)*plVar3;
        }
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pFVar2);
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::pop_back();
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getName() {
        std::string result = name;
        if (this->templateTypes.size()) {
            result += "<";
            for (auto& itr : this->templateTypes) {
                result += itr.getName() + ", ";
            }
            result.pop_back();
            result.pop_back();
            result += ">";
        }
        return result;
    }